

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_move_key_tag2_to_key_tag(Parser *this)

{
  size_t sVar1;
  
  if (((this->m_key_tag2).len != 0) && ((this->m_key_tag2).str != (char *)0x0)) {
    sVar1 = (this->m_key_tag2).len;
    (this->m_key_tag).str = (this->m_key_tag2).str;
    (this->m_key_tag).len = sVar1;
    this->m_key_tag_indentation = this->m_key_tag2_indentation;
    (this->m_key_tag2).str = (char *)0x0;
    (this->m_key_tag2).len = 0;
    this->m_key_tag2_indentation = 0;
  }
  return;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }